

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O2

int32_t __thiscall
sptk::reaper::EpochTracker::FindNccfPeaks
          (EpochTracker *this,vector<float,_std::allocator<float>_> *input,float thresh,
          vector<short,_std::allocator<short>_> *output)

{
  float fVar1;
  short sVar2;
  pointer pfVar3;
  pointer pfVar4;
  pointer pfVar5;
  pointer psVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  short local_3c;
  int16_t max_index;
  float local_38;
  float local_34;
  
  pfVar3 = (input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar4 = (input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  max_index = 1;
  uVar9 = 0;
  local_34 = thresh;
  std::vector<short,_std::allocator<short>_>::resize(output,0);
  local_38 = 0.0;
  local_3c = 1;
  uVar8 = 0;
  while( true ) {
    uVar7 = (uint)uVar8;
    if ((int)((ulong)((long)pfVar3 - (long)pfVar4) >> 2) + -1 <= (int)local_3c) break;
    pfVar5 = (input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    fVar1 = pfVar5[local_3c];
    if (((local_34 < fVar1) &&
        (pfVar5[(long)local_3c + -1] <= fVar1 && fVar1 != pfVar5[(long)local_3c + -1])) &&
       (pfVar5[(long)local_3c + 1] <= fVar1)) {
      if (local_38 < fVar1) {
        uVar9 = uVar8;
        max_index = local_3c;
        local_38 = fVar1;
      }
      uVar8 = (ulong)(uVar7 + 1);
      std::vector<short,_std::allocator<short>_>::push_back(output,&local_3c);
    }
    local_3c = local_3c + 1;
  }
  if (uVar7 < 2 || (short)uVar9 < 1) {
    if (uVar7 == 0) {
      std::vector<short,_std::allocator<short>_>::push_back(output,&max_index);
      uVar7 = 1;
    }
  }
  else {
    psVar6 = (output->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar2 = *psVar6;
    *psVar6 = psVar6[uVar9 & 0xffff];
    psVar6[uVar9 & 0xffff] = sVar2;
  }
  return uVar7;
}

Assistant:

int32_t EpochTracker::FindNccfPeaks(const std::vector<float>& input, float thresh,
                                    std::vector<int16_t>* output) {
  int32_t limit = input.size() - 1;
  uint32_t n_peaks = 0;
  float max_val = 0.0;
  int16_t max_index = 1;
  int16_t max_out_index = 0;
  output->resize(0);
  for (int16_t i = 1; i < limit; ++i) {
    float val = input[i];
    if ((val > thresh) && (val > input[i-1]) && (val >= input[i+1])) {
      if (val > max_val) {
        max_val = val;
        max_out_index = n_peaks;
        max_index = i;
      }
      n_peaks++;
      output->push_back(i);
    }
  }
  //  Be sure the highest peak is the first one in the array.
  if ((n_peaks > 1) && (max_out_index > 0)) {
    int16_t hold = (*output)[0];
    (*output)[0] = (*output)[max_out_index];
    (*output)[max_out_index] = hold;
  } else {
    if (n_peaks <= 0) {
      n_peaks = 1;
      output->push_back(max_index);
    }
  }
  return n_peaks;
}